

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6502Implementation.hpp
# Opt level: O0

uint16_t __thiscall CPU::MOS6502::ProcessorBase::value_of(ProcessorBase *this,Register r)

{
  byte bVar1;
  Register r_local;
  ProcessorBase *this_local;
  
  switch(r) {
  case LastOperationAddress:
    this_local._6_2_ = (this->super_ProcessorStorage).last_operation_pc_.full;
    break;
  case ProgramCounter:
    this_local._6_2_ = (this->super_ProcessorStorage).pc_.full;
    break;
  case StackPointer:
    this_local._6_2_ = (ushort)(this->super_ProcessorStorage).s_;
    break;
  case Flags:
    bVar1 = ProcessorStorage::get_flags(&this->super_ProcessorStorage);
    this_local._6_2_ = (ushort)bVar1;
    break;
  case A:
    this_local._6_2_ = (ushort)(this->super_ProcessorStorage).a_;
    break;
  case X:
    this_local._6_2_ = (ushort)(this->super_ProcessorStorage).x_;
    break;
  case Y:
    this_local._6_2_ = (ushort)(this->super_ProcessorStorage).y_;
    break;
  default:
    this_local._6_2_ = 0;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t ProcessorBase::value_of(Register r) const {
	switch (r) {
		case Register::ProgramCounter:			return pc_.full;
		case Register::LastOperationAddress:	return last_operation_pc_.full;
		case Register::StackPointer:			return s_;
		case Register::Flags:					return get_flags();
		case Register::A:						return a_;
		case Register::X:						return x_;
		case Register::Y:						return y_;
		default: return 0;
	}
}